

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Attribute_PDU::SetAttributeRecordSets
          (Attribute_PDU *this,
          vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
          *AR)

{
  KUINT16 *pKVar1;
  pointer pAVar2;
  pointer pAVar3;
  AttributeRecordSet *pAVar4;
  KUINT16 KVar5;
  pointer pAVar6;
  AttributeRecordSet *this_00;
  
  (this->super_Header).super_Header6.m_ui16PDULength = 0x20;
  pAVar2 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar3 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pAVar6 = pAVar2;
  if (pAVar3 != pAVar2) {
    do {
      (**(pAVar6->super_DataTypeBase)._vptr_DataTypeBase)(pAVar6);
      pAVar6 = pAVar6 + 1;
    } while (pAVar6 != pAVar3);
    (this->m_vAttributeRecordSets).
    super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
    ._M_impl.super__Vector_impl_data._M_finish = pAVar2;
  }
  std::
  vector<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
  ::operator=(&this->m_vAttributeRecordSets,AR);
  this_00 = (this->m_vAttributeRecordSets).
            super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar4 = (this->m_vAttributeRecordSets).
           super__Vector_base<KDIS::DATA_TYPE::AttributeRecordSet,_std::allocator<KDIS::DATA_TYPE::AttributeRecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this->m_ui16NumAttrRecSets = (short)((uint)((int)pAVar4 - (int)this_00) >> 3) * 0x6db7;
  for (; pAVar4 != this_00; this_00 = this_00 + 1) {
    KVar5 = DATA_TYPE::AttributeRecordSet::GetRecordLength(this_00);
    pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar5;
  }
  return;
}

Assistant:

void Attribute_PDU::SetAttributeRecordSets( const vector<AttributeRecordSet> & AR )
{
    ClearAttributeRecordSet();

    m_vAttributeRecordSets = AR;
    m_ui16NumAttrRecSets = m_vAttributeRecordSets.size();

    // Calculate the new pdu length
    vector<AttributeRecordSet>::const_iterator citr = m_vAttributeRecordSets.begin();
    vector<AttributeRecordSet>::const_iterator citrEnd = m_vAttributeRecordSets.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += citr->GetRecordLength();
    }
}